

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int spacePop(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  
  iVar1 = ctxt->spaceNr;
  piVar3 = (int *)(long)iVar1;
  if (0 < (long)piVar3) {
    ctxt->spaceNr = iVar1 - 1U;
    piVar2 = ctxt->spaceTab;
    piVar3 = piVar2 + (long)piVar3 + -2;
    if (iVar1 == 1) {
      piVar3 = piVar2;
    }
    ctxt->space = piVar3;
    piVar2[iVar1 - 1U] = -1;
  }
  return (int)piVar3;
}

Assistant:

static int spacePop(xmlParserCtxtPtr ctxt) {
    int ret;
    if (ctxt->spaceNr <= 0) return(0);
    ctxt->spaceNr--;
    if (ctxt->spaceNr > 0)
	ctxt->space = &ctxt->spaceTab[ctxt->spaceNr - 1];
    else
        ctxt->space = &ctxt->spaceTab[0];
    ret = ctxt->spaceTab[ctxt->spaceNr];
    ctxt->spaceTab[ctxt->spaceNr] = -1;
    return(ret);
}